

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

void __thiscall
booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<char>_>::
update_rule(boundary_point_index_iterator<std::_List_iterator<char>_> *this)

{
  size_t sVar1;
  size_t sVar2;
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  *this_00;
  const_reference pvVar3;
  int __c;
  char *in_RSI;
  boundary_point_index_iterator<std::_List_iterator<char>_> *in_RDI;
  
  sVar1 = in_RDI->current_;
  sVar2 = size((boundary_point_index_iterator<std::_List_iterator<char>_> *)0x14cab0);
  if (sVar1 != sVar2) {
    this_00 = (vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
               *)index(in_RDI,in_RSI,__c);
    pvVar3 = std::
             vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
             ::operator[](this_00,in_RDI->current_);
    boundary_point<std::_List_iterator<char>_>::rule(&in_RDI->value_,pvVar3->rule);
  }
  return;
}

Assistant:

void update_rule()
                    {
                        if(current_ != size()) {
                            value_.rule(index()[current_].rule);
                        }
                    }